

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

int mod2sparse_write(FILE *f,mod2sparse *m)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  FILE *in_RDI;
  int i;
  mod2entry *e;
  int in_stack_ffffffffffffffdc;
  FILE *in_stack_ffffffffffffffe0;
  int local_4;
  
  intio_write(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  iVar1 = ferror(in_RDI);
  if (iVar1 == 0) {
    intio_write(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    iVar1 = ferror(in_RDI);
    if (iVar1 == 0) {
      for (iVar1 = 0; iVar1 < *in_RSI; iVar1 = iVar1 + 1) {
        in_stack_ffffffffffffffe0 = *(FILE **)(*(long *)(in_RSI + 2) + (long)iVar1 * 0x38 + 0x10);
        if (-1 < in_stack_ffffffffffffffe0->_flags) {
          intio_write(in_stack_ffffffffffffffe0,iVar1);
          iVar2 = ferror(in_RDI);
          if (iVar2 != 0) {
            return 0;
          }
          for (; -1 < in_stack_ffffffffffffffe0->_flags;
              in_stack_ffffffffffffffe0 = (FILE *)in_stack_ffffffffffffffe0->_IO_read_end) {
            intio_write(in_stack_ffffffffffffffe0,iVar1);
            iVar2 = ferror(in_RDI);
            if (iVar2 != 0) {
              return 0;
            }
          }
        }
      }
      intio_write(in_stack_ffffffffffffffe0,iVar1);
      iVar1 = ferror(in_RDI);
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mod2sparse_write
( FILE *f,
  mod2sparse *m
)
{
  mod2entry *e;
  int i;

  intio_write(f,m->n_rows);
  if (ferror(f)) return 0;

  intio_write(f,m->n_cols);
  if (ferror(f)) return 0;

  for (i = 0; i<mod2sparse_rows(m); i++)
  { 
    e = mod2sparse_first_in_row(m,i);

    if (!mod2sparse_at_end(e))
    {
      intio_write (f, -(i+1));
      if (ferror(f)) return 0;

      while (!mod2sparse_at_end(e))
      { 
        intio_write (f, mod2sparse_col(e)+1);
        if (ferror(f)) return 0;

        e = mod2sparse_next_in_row(e);
      }
    }
  }

  intio_write(f,0);
  if (ferror(f)) return 0;

  return 1;
}